

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_caster_base.h
# Opt level: O0

value_and_holder * __thiscall
pybind11::detail::instance::get_value_and_holder
          (value_and_holder *__return_storage_ptr__,instance *this,type_info *find_type,
          bool throw_if_missing)

{
  bool bVar1;
  value_and_holder *pvVar2;
  PyTypeObject *type;
  PyTypeObject *type_00;
  string local_160;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  iterator local_90;
  undefined1 local_60 [8];
  iterator it;
  values_and_holders vhs;
  bool throw_if_missing_local;
  type_info *find_type_local;
  instance *this_local;
  
  if ((find_type == (type_info *)0x0) || ((this->ob_base).ob_type == find_type->type)) {
    value_and_holder::value_and_holder(__return_storage_ptr__,this,find_type,0,0);
  }
  else {
    values_and_holders::values_and_holders((values_and_holders *)&it.curr.vh,this);
    values_and_holders::find((iterator *)local_60,(values_and_holders *)&it.curr.vh,find_type);
    values_and_holders::end(&local_90,(values_and_holders *)&it.curr.vh);
    bVar1 = values_and_holders::iterator::operator!=((iterator *)local_60,&local_90);
    if (bVar1) {
      pvVar2 = values_and_holders::iterator::operator*((iterator *)local_60);
      __return_storage_ptr__->inst = pvVar2->inst;
      __return_storage_ptr__->index = pvVar2->index;
      __return_storage_ptr__->type = pvVar2->type;
      __return_storage_ptr__->vh = pvVar2->vh;
    }
    else {
      if (throw_if_missing) {
        get_fully_qualified_tp_name_abi_cxx11_(&local_130,(detail *)find_type->type,type);
        std::operator+(&local_110,"pybind11::detail::instance::get_value_and_holder: `",&local_130);
        std::operator+(&local_f0,&local_110,"\' is not a pybind11 base of the given `");
        get_fully_qualified_tp_name_abi_cxx11_(&local_160,(detail *)(this->ob_base).ob_type,type_00)
        ;
        std::operator+(&local_d0,&local_f0,&local_160);
        std::operator+(&local_b0,&local_d0,"\' instance");
        pybind11_fail(&local_b0);
      }
      memset(__return_storage_ptr__,0,0x20);
      value_and_holder::value_and_holder(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

PYBIND11_NOINLINE value_and_holder
instance::get_value_and_holder(const type_info *find_type /*= nullptr default in common.h*/,
                               bool throw_if_missing /*= true in common.h*/) {
    // Optimize common case:
    if (!find_type || Py_TYPE(this) == find_type->type) {
        return value_and_holder(this, find_type, 0, 0);
    }

    detail::values_and_holders vhs(this);
    auto it = vhs.find(find_type);
    if (it != vhs.end()) {
        return *it;
    }

    if (!throw_if_missing) {
        return value_and_holder();
    }

#if defined(PYBIND11_DETAILED_ERROR_MESSAGES)
    pybind11_fail("pybind11::detail::instance::get_value_and_holder: `"
                  + get_fully_qualified_tp_name(find_type->type)
                  + "' is not a pybind11 base of the given `"
                  + get_fully_qualified_tp_name(Py_TYPE(this)) + "' instance");
#else
    pybind11_fail(
        "pybind11::detail::instance::get_value_and_holder: "
        "type is not a pybind11 base of the given instance "
        "(#define PYBIND11_DETAILED_ERROR_MESSAGES or compile in debug mode for type details)");
#endif
}